

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_set_var_test(btree_kv_ops *kv_ops)

{
  int iVar1;
  size_t sVar2;
  bnode *__ptr;
  char *__format;
  char key [4];
  uint64_t value;
  timeval __test_begin;
  char local_4c [4];
  long local_48;
  timeval local_40;
  
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  memleak_start();
  builtin_strncpy(local_4c,"key",4);
  local_48 = 10;
  sVar2 = strlen(local_4c);
  __ptr = (bnode *)malloc(0x1010);
  __ptr->kvsize = 0;
  __ptr->flag = 0;
  __ptr->level = 0;
  __ptr->nentry = 0;
  (__ptr->field_4).data = (void *)0x0;
  __ptr->kvsize = (ushort)((int)sVar2 << 8) | 8;
  __ptr->level = 1;
  (__ptr->field_4).data = __ptr + 1;
  (*kv_ops->set_kv)(__ptr,0,local_4c,&local_48);
  iVar1 = bcmp((__ptr->field_4).data,local_4c,sVar2 & 0xff);
  if (iVar1 != 0) {
    kv_set_var_test();
  }
  if (*(long *)((long)(__ptr->field_4).data + (sVar2 & 0xff)) != local_48) {
    kv_set_var_test();
  }
  free(__ptr);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_set_var_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv set var test");
  return;
}

Assistant:

void kv_set_var_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    bnoderef node;
    uint8_t ksize, vsize;
    int level;
    idx_t idx;
    char key[] = "key";
    uint64_t value = 10;

    ksize = strlen(key);
    vsize = sizeof(value);

    // set key/value in node
    idx = 0;
    level = 1;
    node = dummy_node(ksize, vsize, level);
    kv_ops->set_kv(node, idx, (void*)key, (void*)&value);

    // verify node->data
    TEST_CHK(!(memcmp(node->data, key, ksize)));
    TEST_CHK(!(memcmp((uint8_t*)node->data + ksize, &value, vsize)));

    free(node);

    memleak_end();
    TEST_RESULT("kv set var test");
}